

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

bool __thiscall booster::log::logger::should_be_logged(logger *this,level_type level,char *module)

{
  int iVar1;
  char *in_RDX;
  int in_ESI;
  int *in_RDI;
  entry *p;
  level_type module_level;
  long *local_28;
  int local_1c;
  
  local_1c = *in_RDI;
  local_28 = (long *)(in_RDI + 2);
  do {
    if (*local_28 == 0) {
LAB_00220f12:
      return in_ESI <= local_1c;
    }
    iVar1 = strcmp((char *)*local_28,in_RDX);
    if (iVar1 == 0) {
      local_1c = (int)local_28[1];
      goto LAB_00220f12;
    }
    local_28 = local_28 + 2;
  } while( true );
}

Assistant:

bool logger::should_be_logged(level_type level,char const *module)
	{
		level_type module_level = default_level_;
		for(entry *p=entries_;p->module;p++) {
			if(strcmp(p->module,module)==0) {
				module_level=p->level;
				break;
			}
		}
		return level <= module_level;
	}